

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::row_position(Fl_Table *this,int row)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double local_20;
  double newtop;
  int row_local;
  Fl_Table *this_local;
  
  if (this->_row_position != row) {
    if (row < 0) {
      newtop._4_4_ = 0;
    }
    else {
      iVar1 = rows(this);
      newtop._4_4_ = row;
      if (iVar1 <= row) {
        iVar1 = rows(this);
        newtop._4_4_ = iVar1 + -1;
      }
    }
    if (this->tih < this->table_h) {
      lVar2 = row_scroll_position(this,newtop._4_4_);
      local_20 = (double)lVar2;
      dVar3 = Fl_Valuator::maximum((Fl_Valuator *)this->vscrollbar);
      if (dVar3 < local_20) {
        local_20 = Fl_Valuator::maximum((Fl_Valuator *)this->vscrollbar);
      }
      Fl_Valuator::value((Fl_Valuator *)this->vscrollbar,local_20);
      table_scrolled(this);
      Fl_Widget::redraw((Fl_Widget *)this);
      this->_row_position = newtop._4_4_;
    }
  }
  return;
}

Assistant:

void Fl_Table::row_position(int row) {
  if ( _row_position == row ) return;		// OPTIMIZATION: no change? avoid redraw
  if ( row < 0 ) row = 0;
  else if ( row >= rows() ) row = rows() - 1;
  if ( table_h <= tih ) return;			// don't scroll if table smaller than window
  double newtop = row_scroll_position(row);
  if ( newtop > vscrollbar->maximum() ) {
    newtop = vscrollbar->maximum();
  }
  vscrollbar->Fl_Slider::value(newtop);
  table_scrolled();
  redraw();
  _row_position = row;	// HACK: override what table_scrolled() came up with
}